

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

int __thiscall
sznet::net::TcpClient::connect(TcpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  LogLevel LVar1;
  int extraout_EAX;
  LogStream *this_00;
  self *psVar2;
  element_type *peVar3;
  SourceFile file;
  InetAddress local_1020;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  TcpClient *local_10;
  TcpClient *this_local;
  
  local_10 = this;
  LVar1 = Logger::logLevel();
  if ((int)LVar1 < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_ff0,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x62);
    this_00 = Logger::stream(&local_fe0);
    psVar2 = LogStream::operator<<(this_00,"TcpClient::connect[");
    psVar2 = LogStream::operator<<(psVar2,&this->m_name);
    psVar2 = LogStream::operator<<(psVar2,"] - connecting to ");
    peVar3 = std::
             __shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_connector);
    Connector::serverAddress(peVar3);
    InetAddress::toIpPort_abi_cxx11_(&local_1020);
    LogStream::operator<<(psVar2,(string *)&local_1020);
    std::__cxx11::string::~string((string *)&local_1020);
    Logger::~Logger(&local_fe0);
  }
  this->m_connect = true;
  peVar3 = std::__shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_connector);
  Connector::start(peVar3);
  return extraout_EAX;
}

Assistant:

void TcpClient::connect()
{
	// FIXME: check state
	LOG_INFO << "TcpClient::connect[" << m_name << "] - connecting to "
			<< m_connector->serverAddress().toIpPort();
	m_connect = true;
	m_connector->start();
}